

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

void __thiscall soul::heart::Parser::parseStateVariable(Parser *this)

{
  void **__s;
  ProgramImpl *pPVar1;
  Module *pMVar2;
  size_t sVar3;
  pointer pcVar4;
  size_type sVar5;
  pool_ref<soul::heart::Variable> *ppVar6;
  bool bVar7;
  bool bVar8;
  Variable *v;
  PoolItem *pPVar9;
  AggregateInitialiserList *pAVar10;
  int line;
  long lVar11;
  char *pcVar12;
  char *message;
  Identifier *in_R9;
  string_view newString;
  string_view other;
  Identifier name;
  FunctionParseState parseState;
  Type type;
  Identifier local_90;
  undefined1 local_88 [32];
  Ptr PStack_68;
  UTF8Reader local_60;
  pointer ppStack_58;
  BlockCode *local_50;
  Type local_48;
  
  bVar7 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"external");
  if (bVar7) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
  }
  readValueType(&local_48,this);
  pPVar1 = (this->program).pimpl;
  readVariableIdentifier_abi_cxx11_((string *)local_88,this);
  newString._M_str = (char *)local_88._0_8_;
  newString._M_len = local_88._8_8_;
  local_90 = Identifier::Pool::get(&(pPVar1->allocator).identifiers,newString);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  pMVar2 = (this->module).object;
  if (pMVar2 == (Module *)0x0) {
    line = 0x3c;
    pcVar12 = "operator->";
    message = "object != nullptr";
  }
  else {
    if (local_90.name != (string *)0x0) {
      sVar3 = (pMVar2->stateVariables).stateVariables.numActive;
      if (sVar3 != 0) {
        pcVar4 = ((local_90.name)->_M_dataplus)._M_p;
        sVar5 = (local_90.name)->_M_string_length;
        ppVar6 = (pMVar2->stateVariables).stateVariables.items;
        lVar11 = 0;
        do {
          other._M_str = pcVar4;
          other._M_len = sVar5;
          bVar8 = Identifier::operator==
                            ((Identifier *)(*(long *)((long)&ppVar6->object + lVar11) + 0x30),other)
          ;
          if (bVar8) {
            if (*(long *)((long)&ppVar6->object + lVar11) != 0) {
              CompileMessageHelpers::createMessage<soul::Identifier&>
                        ((CompileMessage *)local_88,(CompileMessageHelpers *)0x1,none,0x27b770,
                         (char *)&local_90,in_R9);
              (*(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                )._vptr_Tokeniser[2])(this,local_88);
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull(PStack_68.object);
              if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
                operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
              }
            }
            break;
          }
          lVar11 = lVar11 + 8;
        } while (sVar3 << 3 != lVar11);
      }
      pMVar2 = (this->module).object;
      if (pMVar2 != (Module *)0x0) {
        local_88._0_4_ = (uint)bVar7 << 2;
        v = PoolAllocator::
            allocate<soul::heart::Variable,soul::CodeLocation&,soul::Type&,soul::Identifier&,soul::heart::Variable::Role>
                      (&pMVar2->allocator->pool,
                       &(this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ).location,&local_48,&local_90,(Role *)local_88);
        bVar7 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x259fb3);
        if (bVar7) {
          pMVar2 = (this->module).object;
          if (pMVar2 == (Module *)0x0) {
            throwInternalCompilerError("object != nullptr","operator->",0x3c);
          }
          pPVar9 = PoolAllocator::allocateSpaceForObject(&pMVar2->allocator->pool,0xe0);
          __s = &pPVar9->item;
          memset(__s,0,0xe0);
          pPVar9->item = &PTR__Function_002d0d40;
          pPVar9[1].destructor = (DestructorFn *)0x0;
          pPVar9[1].item = (void *)0x0;
          *(undefined8 *)&pPVar9[1].field_0x18 = 0;
          pPVar9[2].size = 0;
          pPVar9[2].destructor = (DestructorFn *)(pPVar9 + 3);
          *(undefined8 *)&pPVar9[2].field_0x18 = 4;
          pPVar9[4].size = 0;
          pPVar9[4].destructor = (DestructorFn *)0x0;
          pPVar9[4].item = (void *)0x0;
          *(undefined8 *)&pPVar9[4].field_0x18 = 0;
          pPVar9[5].size = (size_t)&PTR__StringDictionary_002ca250;
          pPVar9[5].destructor = (DestructorFn *)0x0;
          pPVar9[5].item = (void *)0x0;
          *(undefined8 *)&pPVar9[5].field_0x18 = 0;
          *(undefined4 *)&pPVar9[6].size = 1;
          pPVar9[6].item = (void *)0x0;
          *(undefined8 *)&pPVar9[6].field_0x18 = 0;
          *(undefined8 *)&pPVar9[6].field_0x1f = 0;
          pPVar9->destructor =
               PoolAllocator::allocate<soul::heart::Function>::anon_class_1_0_00000001::__invoke;
          local_88._8_8_ = (pointer)0x0;
          local_88._16_8_ = 0;
          local_88._24_8_ = 0;
          PStack_68.object = (SourceCodeText *)0x0;
          local_60.data = (char *)0x0;
          ppStack_58 = (pointer)0x0;
          local_50 = (BlockCode *)0x0;
          pcVar12 = (this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ).currentType.text;
          local_88._0_8_ = __s;
          if ((pcVar12 == "(") ||
             (((pcVar12 != (char *)0x0 && (*pcVar12 == '(')) && (pcVar12[1] == '\0')))) {
            pAVar10 = parseInitialiserList(this,(FunctionParseState *)local_88,&local_48);
          }
          else {
            pAVar10 = (AggregateInitialiserList *)
                      parseExpression(this,(FunctionParseState *)local_88);
          }
          (v->initialValue).object = &pAVar10->super_Expression;
          if (PStack_68.object != (SourceCodeText *)0x0) {
            operator_delete(PStack_68.object,(long)ppStack_58 - (long)PStack_68.object);
          }
          if ((pointer)local_88._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_88._8_8_,local_88._24_8_ - local_88._8_8_);
          }
        }
        parseAnnotation(this,&v->annotation);
        pMVar2 = (this->module).object;
        if (pMVar2 != (Module *)0x0) {
          Module::StateVariables::add(&pMVar2->stateVariables,v);
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::expect<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2585e7);
          RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
          return;
        }
      }
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    line = 0x22;
    pcVar12 = "operator basic_string_view";
    message = "isValid()";
  }
  throwInternalCompilerError(message,pcVar12,line);
}

Assistant:

void parseStateVariable()
    {
        bool isExternal = matchIf ("external");
        auto type = readValueType();
        auto name = program.getAllocator().get (readVariableIdentifier());

        if (module->stateVariables.find (name))
            throwError (Errors::nameInUse (name));

        auto& v = module->allocate<heart::Variable> (location, type, name,
                                                     isExternal ? heart::Variable::Role::external
                                                                : heart::Variable::Role::state);

        if (matchIf (HEARTOperator::assign))
        {
            FunctionParseState parseState (module->allocate<heart::Function>());

            if (matches (HEARTOperator::openParen))
                v.initialValue = parseInitialiserList (parseState, type);
            else
                v.initialValue = parseExpression (parseState);
        }

        parseAnnotation (v.annotation);

        module->stateVariables.add (v);
        expectSemicolon();
    }